

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O3

ShaderCodeVariableDesc *
Diligent::GLDataTypeToShaderCodeVariableDesc
          (ShaderCodeVariableDesc *__return_storage_ptr__,GLenum glDataType)

{
  char *pcVar1;
  undefined4 uVar2;
  
  __return_storage_ptr__->Class = SHADER_CODE_VARIABLE_CLASS_UNKNOWN;
  __return_storage_ptr__->BasicType = SHADER_CODE_BASIC_TYPE_UNKNOWN;
  __return_storage_ptr__->NumRows = '\0';
  __return_storage_ptr__->NumColumns = '\0';
  __return_storage_ptr__->Offset = 0;
  __return_storage_ptr__->ArraySize = 0;
  __return_storage_ptr__->NumMembers = 0;
  __return_storage_ptr__->Name = (char *)0x0;
  __return_storage_ptr__->TypeName = (char *)0x0;
  __return_storage_ptr__->pMembers = (ShaderCodeVariableDesc *)0x0;
  if ((int)glDataType < 0x8dc6) {
    switch(glDataType) {
    case 0x8b50:
      uVar2 = 0x1020b02;
      pcVar1 = "vec2";
      break;
    case 0x8b51:
      uVar2 = 0x1030b02;
      pcVar1 = "vec3";
      break;
    case 0x8b52:
      uVar2 = 0x1040b02;
      pcVar1 = "vec4";
      break;
    case 0x8b53:
      uVar2 = 0x1020302;
      pcVar1 = "ivec2";
      break;
    case 0x8b54:
      uVar2 = 0x1030302;
      pcVar1 = "ivec3";
      break;
    case 0x8b55:
      uVar2 = 0x1040302;
      pcVar1 = "ivec4";
      break;
    case 0x8b56:
      uVar2 = 0x1010201;
      pcVar1 = "bool";
      break;
    case 0x8b57:
      uVar2 = 0x1020202;
      pcVar1 = "bvec2";
      break;
    case 0x8b58:
      uVar2 = 0x1030202;
      pcVar1 = "bvec3";
      break;
    case 0x8b59:
      uVar2 = 0x1040202;
      pcVar1 = "bvec4";
      break;
    case 0x8b5a:
      uVar2 = 0x2020b04;
      pcVar1 = "mat2x2";
      break;
    case 0x8b5b:
      uVar2 = 0x3030b04;
      pcVar1 = "mat3x3";
      break;
    case 0x8b5c:
      uVar2 = 0x4040b04;
      pcVar1 = "mat4x4";
      break;
    case 0x8b5d:
    case 0x8b5e:
    case 0x8b5f:
    case 0x8b60:
    case 0x8b61:
    case 0x8b62:
    case 0x8b63:
    case 0x8b64:
      goto switchD_0016dce7_caseD_8b5d;
    case 0x8b65:
      uVar2 = 0x2030b04;
      pcVar1 = "mat2x3";
      break;
    case 0x8b66:
      uVar2 = 0x2040b04;
      pcVar1 = "mat2x4";
      break;
    case 0x8b67:
      uVar2 = 0x3020b04;
      pcVar1 = "mat3x2";
      break;
    case 0x8b68:
      uVar2 = 0x3040b04;
      pcVar1 = "mat3x4";
      break;
    case 0x8b69:
      uVar2 = 0x4020b04;
      pcVar1 = "mat4x2";
      break;
    case 0x8b6a:
      uVar2 = 0x4030b04;
      pcVar1 = "mat4x3";
      break;
    default:
      switch(glDataType) {
      case 0x1404:
        uVar2 = 0x1010301;
        pcVar1 = "int";
        break;
      case 0x1405:
        uVar2 = 0x1010701;
        pcVar1 = "uint";
        break;
      case 0x1406:
        uVar2 = 0x1010b01;
        pcVar1 = "float";
        break;
      default:
        goto switchD_0016dce7_caseD_8b5d;
      case 0x140a:
        uVar2 = 0x1010d01;
        pcVar1 = "double";
      }
    }
  }
  else if ((int)glDataType < 0x8f46) {
    if (glDataType == 0x8dc6) {
      uVar2 = 0x1020702;
      pcVar1 = "uvec2";
    }
    else if (glDataType == 0x8dc7) {
      uVar2 = 0x1030702;
      pcVar1 = "uvec3";
    }
    else {
      if (glDataType != 0x8dc8) {
        return __return_storage_ptr__;
      }
      uVar2 = 0x1040702;
      pcVar1 = "uvec4";
    }
  }
  else if ((int)glDataType < 0x8ffc) {
    switch(glDataType) {
    case 0x8f46:
      uVar2 = 0x2020d04;
      pcVar1 = "dmat2";
      break;
    case 0x8f47:
      uVar2 = 0x3030d04;
      pcVar1 = "dmat3";
      break;
    case 0x8f48:
      uVar2 = 0x4040d04;
      pcVar1 = "dmat4";
      break;
    case 0x8f49:
      uVar2 = 0x2030d04;
      pcVar1 = "dmat2x3";
      break;
    case 0x8f4a:
      uVar2 = 0x2040d04;
      pcVar1 = "dmat2x4";
      break;
    case 0x8f4b:
      uVar2 = 0x3020d04;
      pcVar1 = "dmat3x2";
      break;
    case 0x8f4c:
      uVar2 = 0x3040d04;
      pcVar1 = "dmat3x4";
      break;
    case 0x8f4d:
      uVar2 = 0x4020d04;
      pcVar1 = "dmat4x2";
      break;
    case 0x8f4e:
      uVar2 = 0x4030d04;
      pcVar1 = "dmat4x3";
      break;
    default:
      goto switchD_0016dce7_caseD_8b5d;
    }
  }
  else if (glDataType == 0x8ffc) {
    uVar2 = 0x1020d02;
    pcVar1 = "dvec2";
  }
  else if (glDataType == 0x8ffd) {
    uVar2 = 0x1030d02;
    pcVar1 = "dvec3";
  }
  else {
    if (glDataType != 0x8ffe) {
      return __return_storage_ptr__;
    }
    uVar2 = 0x1040d02;
    pcVar1 = "dvec4";
  }
  __return_storage_ptr__->Class = (char)uVar2;
  __return_storage_ptr__->BasicType = (char)((uint)uVar2 >> 8);
  __return_storage_ptr__->NumRows = (char)((uint)uVar2 >> 0x10);
  __return_storage_ptr__->NumColumns = (char)((uint)uVar2 >> 0x18);
  __return_storage_ptr__->TypeName = pcVar1;
switchD_0016dce7_caseD_8b5d:
  return __return_storage_ptr__;
}

Assistant:

ShaderCodeVariableDesc GLDataTypeToShaderCodeVariableDesc(GLenum glDataType)
{
    ShaderCodeVariableDesc Desc;
    switch (glDataType)
    {
        case GL_FLOAT:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "float";
            break;

        case GL_FLOAT_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "vec2";
            break;

        case GL_FLOAT_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "vec3";
            break;

        case GL_FLOAT_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "vec4";
            break;

        case GL_DOUBLE:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "double";
            break;

        case GL_DOUBLE_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dvec2";
            break;

        case GL_DOUBLE_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dvec3";
            break;

        case GL_DOUBLE_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dvec4";
            break;

        case GL_INT:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "int";
            break;

        case GL_INT_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "ivec2";
            break;

        case GL_INT_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "ivec3";
            break;

        case GL_INT_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_INT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "ivec4";
            break;

        case GL_UNSIGNED_INT:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "uint";
            break;

        case GL_UNSIGNED_INT_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "uvec2";
            break;

        case GL_UNSIGNED_INT_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "uvec3";
            break;

        case GL_UNSIGNED_INT_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_UINT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "uvec4";
            break;

        case GL_BOOL:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_SCALAR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 1;
            Desc.TypeName   = "bool";
            break;

        case GL_BOOL_VEC2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 2;
            Desc.TypeName   = "bvec2";
            break;

        case GL_BOOL_VEC3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 3;
            Desc.TypeName   = "bvec3";
            break;

        case GL_BOOL_VEC4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_BOOL;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_VECTOR;
            Desc.NumColumns = 1;
            Desc.NumRows    = 4;
            Desc.TypeName   = "bvec4";
            break;

        case GL_FLOAT_MAT2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 2;
            Desc.TypeName   = "mat2x2";
            break;

        case GL_FLOAT_MAT3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 3;
            Desc.TypeName   = "mat3x3";
            break;

        case GL_FLOAT_MAT4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 4;
            Desc.TypeName   = "mat4x4";
            break;

        case GL_FLOAT_MAT2x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 3;
            Desc.TypeName   = "mat2x3";
            break;

        case GL_FLOAT_MAT2x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 4;
            Desc.TypeName   = "mat2x4";
            break;

        case GL_FLOAT_MAT3x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 2;
            Desc.TypeName   = "mat3x2";
            break;

        case GL_FLOAT_MAT3x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 4;
            Desc.TypeName   = "mat3x4";
            break;

        case GL_FLOAT_MAT4x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 2;
            Desc.TypeName   = "mat4x2";
            break;

        case GL_FLOAT_MAT4x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_FLOAT;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 3;
            Desc.TypeName   = "mat4x3";
            break;

        case GL_DOUBLE_MAT2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dmat2";
            break;

        case GL_DOUBLE_MAT3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dmat3";
            break;

        case GL_DOUBLE_MAT4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dmat4";
            break;

        case GL_DOUBLE_MAT2x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dmat2x3";
            break;

        case GL_DOUBLE_MAT2x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 2;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dmat2x4";
            break;

        case GL_DOUBLE_MAT3x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dmat3x2";
            break;

        case GL_DOUBLE_MAT3x4:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 3;
            Desc.NumRows    = 4;
            Desc.TypeName   = "dmat3x4";
            break;

        case GL_DOUBLE_MAT4x2:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 2;
            Desc.TypeName   = "dmat4x2";
            break;

        case GL_DOUBLE_MAT4x3:
            Desc.BasicType  = SHADER_CODE_BASIC_TYPE_DOUBLE;
            Desc.Class      = SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS;
            Desc.NumColumns = 4;
            Desc.NumRows    = 3;
            Desc.TypeName   = "dmat4x3";
            break;

        default:
            // Unknown type - skip
            break;
    }

    return Desc;
}